

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_http_client_async_blocking_timeout.cpp
# Opt level: O0

bool __thiscall Client::ReadResponse(Client *this)

{
  bool bVar1;
  ostream *poVar2;
  error_code local_88 [2];
  error_code local_68;
  anon_class_16_2_e8808019_for_handler_ local_58;
  mutable_buffer local_48;
  undefined1 local_38 [8];
  error_code ec;
  duration local_20;
  Client *local_18;
  Client *this_local;
  
  local_18 = this;
  std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>
            ((duration<long,std::ratio<1l,1l>> *)&ec.cat_,&kMaxReceiveSeconds);
  std::chrono::duration<long,std::ratio<1l,1000000000l>>::duration<long,std::ratio<1l,1l>,void>
            ((duration<long,std::ratio<1l,1000000000l>> *)&local_20,
             (duration<long,_std::ratio<1L,_1L>_> *)&ec.cat_);
  boost::asio::
  basic_waitable_timer<std::chrono::_V2::steady_clock,_boost::asio::wait_traits<std::chrono::_V2::steady_clock>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::expires_after(&this->deadline_,&local_20);
  boost::system::error_code::error_code<boost::asio::error::basic_errors>
            ((error_code *)local_38,try_again,(type *)0x0);
  local_48 = boost::asio::buffer<char,std::allocator<char>>(&this->buffer_);
  local_58.ec = (error_code *)local_38;
  local_58.this = this;
  boost::asio::ssl::
  stream<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>
  ::async_read_some<boost::asio::mutable_buffer,Client::ReadResponse()::__0>
            ((stream<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>
              *)&this->ssl_socket_,&local_48,&local_58);
  do {
    boost::asio::io_context::run_one(&this->io_context_);
    boost::system::error_code::error_code<boost::asio::error::basic_errors>
              (&local_68,try_again,(type *)0x0);
    bVar1 = boost::system::operator==((error_code *)local_38,&local_68);
  } while (bVar1);
  bVar1 = boost::system::error_code::operator_cast_to_bool((error_code *)local_38);
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Read failed: ");
    boost::system::error_code::message_abi_cxx11_(local_88);
    poVar2 = std::operator<<(poVar2,(string *)local_88);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)local_88);
  }
  this_local._7_1_ = !bVar1;
  return this_local._7_1_;
}

Assistant:

bool Client::ReadResponse() {
  deadline_.expires_after(std::chrono::seconds(kMaxReceiveSeconds));

  boost::system::error_code ec = boost::asio::error::would_block;

  ssl_socket_.async_read_some(
      boost::asio::buffer(buffer_),
      [this, &ec](boost::system::error_code inner_ec, std::size_t length) {
        ec = inner_ec;

        if (inner_ec || length == 0) {
          std::cout << "Socket read error." << std::endl;
          return;
        }

        std::cout.write(buffer_.data(), length);

        // TODO: Call ReadResponse() to read until the end.
        ReadResponse();
      });

  // Block until the asynchronous operation has completed.
  do {
    io_context_.run_one();
  } while (ec == boost::asio::error::would_block);

  if (ec) {
    std::cout << "Read failed: " << ec.message() << std::endl;
    return false;
  }

  return true;
}